

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

void sq_base_register(HSQUIRRELVM v)

{
  SQChar *s;
  SQFUNCTION func;
  long lVar1;
  
  sq_pushroottable(v);
  for (lVar1 = 0x18; lVar1 != 0x298; lVar1 = lVar1 + 0x20) {
    s = *(SQChar **)((long)&SQVM::typeinfo + lVar1);
    func = *(SQFUNCTION *)((long)&PTR_typeinfo_name_00136990 + lVar1);
    sq_pushstring(v,s,-1);
    sq_newclosure(v,func,0);
    sq_setnativeclosurename(v,-1,s);
    sq_setparamscheck(v,*(SQInteger *)((long)&PTR_typeinfo_00136998 + lVar1),
                      *(SQChar **)((long)&base_funcs[0].name + lVar1));
    sq_newslot(v,-3,0);
  }
  sq_pushstring(v,"_versionnumber_",-1);
  sq_pushinteger(v,0x136);
  sq_newslot(v,-3,0);
  sq_pushstring(v,"_version_",-1);
  sq_pushstring(v,"Squirrel 3.1 stable",-1);
  sq_newslot(v,-3,0);
  sq_pushstring(v,"_charsize_",-1);
  sq_pushinteger(v,1);
  sq_newslot(v,-3,0);
  sq_pushstring(v,"_intsize_",-1);
  sq_pushinteger(v,8);
  sq_newslot(v,-3,0);
  sq_pushstring(v,"_floatsize_",-1);
  sq_pushinteger(v,4);
  sq_newslot(v,-3,0);
  sq_pop(v,1);
  return;
}

Assistant:

void sq_base_register(HSQUIRRELVM v)
{
    SQInteger i=0;
    sq_pushroottable(v);
    while(base_funcs[i].name!=0) {
        sq_pushstring(v,base_funcs[i].name,-1);
        sq_newclosure(v,base_funcs[i].f,0);
        sq_setnativeclosurename(v,-1,base_funcs[i].name);
        sq_setparamscheck(v,base_funcs[i].nparamscheck,base_funcs[i].typemask);
        sq_newslot(v,-3, SQFalse);
        i++;
    }

    sq_pushstring(v,_SC("_versionnumber_"),-1);
    sq_pushinteger(v,SQUIRREL_VERSION_NUMBER);
    sq_newslot(v,-3, SQFalse);
    sq_pushstring(v,_SC("_version_"),-1);
    sq_pushstring(v,SQUIRREL_VERSION,-1);
    sq_newslot(v,-3, SQFalse);
    sq_pushstring(v,_SC("_charsize_"),-1);
    sq_pushinteger(v,sizeof(SQChar));
    sq_newslot(v,-3, SQFalse);
    sq_pushstring(v,_SC("_intsize_"),-1);
    sq_pushinteger(v,sizeof(SQInteger));
    sq_newslot(v,-3, SQFalse);
    sq_pushstring(v,_SC("_floatsize_"),-1);
    sq_pushinteger(v,sizeof(SQFloat));
    sq_newslot(v,-3, SQFalse);
    sq_pop(v,1);
}